

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O3

bool __thiscall Fossilize::StreamArchive::has_entry(StreamArchive *this,ResourceTag tag,Hash hash)

{
  bool bVar1;
  const_iterator cVar2;
  Hash local_20;
  
  local_20 = hash;
  bVar1 = DatabaseInterface::test_resource_filter(&this->super_DatabaseInterface,tag,hash);
  if (bVar1) {
    if (this->imported_metadata != (ExportedMetadataHeader *)0x0) {
      bVar1 = find_entry_from_metadata(this->imported_metadata,tag,hash,(Entry *)0x0);
      return bVar1;
    }
    cVar2 = std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&this->seen_blobs[tag]._M_h,&local_20);
    bVar1 = cVar2.
            super__Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>,_false>
            ._M_cur != (__node_type *)0x0;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool has_entry(ResourceTag tag, Hash hash) override
	{
		if (!test_resource_filter(tag, hash))
			return false;

		if (imported_metadata)
			return find_entry_from_metadata(imported_metadata, tag, hash, nullptr);
		else
			return seen_blobs[tag].count(hash) != 0;
	}